

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImRect ImGui::TableGetCellBgRect(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  float fVar2;
  float fVar3;
  ImRect IVar4;
  
  pIVar1 = (table->Columns).Data;
  fVar2 = pIVar1[column_n].MinX;
  if (pIVar1[column_n].PrevEnabledColumn == -1) {
    fVar2 = fVar2 - table->CellSpacingX1;
  }
  fVar3 = pIVar1[column_n].MaxX;
  if (pIVar1[column_n].NextEnabledColumn == -1) {
    fVar3 = fVar3 + table->CellSpacingX2;
  }
  IVar4.Min.y = table->RowPosY1;
  IVar4.Min.x = fVar2;
  IVar4.Max.y = table->RowPosY2;
  IVar4.Max.x = fVar3;
  return IVar4;
}

Assistant:

inline const T&     operator[](int i) const     { const T* p = Data + i; IM_ASSERT(p >= Data && p < DataEnd); return *p; }